

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_statistics.cpp
# Opt level: O2

bool duckdb::ApplyBloomFilter(TableFilter *duckdb_filter,ParquetBloomFilter *bloom_filter)

{
  TableFilterType TVar1;
  char cVar2;
  PhysicalType PVar3;
  pointer puVar4;
  bool bVar5;
  bool bVar6;
  ConstantFilter *pCVar7;
  Value *this;
  ConjunctionOrFilter *pCVar8;
  type pTVar9;
  ConjunctionAndFilter *pCVar10;
  unsigned_long_long x;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *child_filter;
  pointer puVar11;
  string local_40;
  
  TVar1 = duckdb_filter->filter_type;
  if (TVar1 == CONJUNCTION_AND) {
    pCVar10 = TableFilter::Cast<duckdb::ConjunctionAndFilter>(duckdb_filter);
    puVar4 = (pCVar10->super_ConjunctionFilter).child_filters.
             super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar5 = false;
    for (puVar11 = (pCVar10->super_ConjunctionFilter).child_filters.
                   super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar4;
        puVar11 = puVar11 + 1) {
      pTVar9 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
               operator*(puVar11);
      bVar6 = ApplyBloomFilter(pTVar9,bloom_filter);
      bVar5 = (bool)(bVar5 | bVar6);
    }
  }
  else if (TVar1 == CONJUNCTION_OR) {
    pCVar8 = TableFilter::Cast<duckdb::ConjunctionOrFilter>(duckdb_filter);
    puVar4 = (pCVar8->super_ConjunctionFilter).child_filters.
             super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar5 = true;
    for (puVar11 = (pCVar8->super_ConjunctionFilter).child_filters.
                   super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar4;
        puVar11 = puVar11 + 1) {
      pTVar9 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
               operator*(puVar11);
      bVar6 = ApplyBloomFilter(pTVar9,bloom_filter);
      bVar5 = (bool)(bVar5 & bVar6);
    }
  }
  else {
    if (TVar1 == CONSTANT_COMPARISON) {
      pCVar7 = TableFilter::Cast<duckdb::ConstantFilter>(duckdb_filter);
      cVar2 = (pCVar7->super_TableFilter).field_0x9;
      PVar3 = (pCVar7->constant).type_.physical_type_;
      this = &pCVar7->constant;
      bVar5 = false;
      switch(PVar3) {
      case UINT8:
      case INT8:
      case UINT16:
      case INT16:
      case INT32:
        x = ValueXH64FixedWidth<int>(this);
        break;
      case UINT32:
        x = ValueXH64FixedWidth<unsigned_int>(this);
        break;
      case UINT64:
        x = ValueXH64FixedWidth<unsigned_long>(this);
        break;
      case INT64:
        x = ValueXH64FixedWidth<long>(this);
        break;
      case UINT64|UINT8:
        goto switchD_00d92a32_caseD_a;
      case FLOAT:
        x = ValueXH64FixedWidth<float>(this);
        break;
      case DOUBLE:
        x = ValueXH64FixedWidth<double>(this);
        break;
      default:
        if (PVar3 != VARCHAR) {
          return false;
        }
        Value::GetValue<std::__cxx11::string>(&local_40,this);
        x = duckdb_zstd::XXH64(local_40._M_dataplus._M_p,local_40._M_string_length,0);
        ::std::__cxx11::string::~string((string *)&local_40);
      }
      if (x != 0) {
        bVar5 = ParquetBloomFilter::FilterCheck(bloom_filter,x);
        return (bool)(~bVar5 & cVar2 == '\x19');
      }
    }
    bVar5 = false;
  }
switchD_00d92a32_caseD_a:
  return bVar5;
}

Assistant:

static bool ApplyBloomFilter(const TableFilter &duckdb_filter, ParquetBloomFilter &bloom_filter) {
	switch (duckdb_filter.filter_type) {
	case TableFilterType::CONSTANT_COMPARISON: {
		auto &constant_filter = duckdb_filter.Cast<ConstantFilter>();
		auto is_compare_equal = constant_filter.comparison_type == ExpressionType::COMPARE_EQUAL;
		D_ASSERT(!constant_filter.constant.IsNull());
		auto hash = ValueXXH64(constant_filter.constant);
		return hash > 0 && !bloom_filter.FilterCheck(hash) && is_compare_equal;
	}
	case TableFilterType::CONJUNCTION_AND: {
		auto &conjunction_and_filter = duckdb_filter.Cast<ConjunctionAndFilter>();
		bool any_children_true = false;
		for (auto &child_filter : conjunction_and_filter.child_filters) {
			any_children_true |= ApplyBloomFilter(*child_filter, bloom_filter);
		}
		return any_children_true;
	}
	case TableFilterType::CONJUNCTION_OR: {
		auto &conjunction_or_filter = duckdb_filter.Cast<ConjunctionOrFilter>();
		bool all_children_true = true;
		for (auto &child_filter : conjunction_or_filter.child_filters) {
			all_children_true &= ApplyBloomFilter(*child_filter, bloom_filter);
		}
		return all_children_true;
	}
	default:
		return false;
	}
}